

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyReadWireLoad(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  double dVar4;
  float Second;
  int First;
  char *pHead;
  Scl_Item_t *pChild;
  Scl_Item_t *pItem;
  Vec_Str_t *vOut_local;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  iVar1 = Scl_LibertyItemNum(p,pSVar2,"wire_load");
  Vec_StrPutI_(vOut,iVar1);
  Vec_StrPut_(vOut);
  pSVar2 = Scl_LibertyRoot(p);
  for (pChild = Scl_LibertyItem(p,pSVar2->Child); pChild != (Scl_Item_t *)0x0;
      pChild = Scl_LibertyItem(p,pChild->Next)) {
    iVar1 = Scl_LibertyCompare(p,pChild->Key,"wire_load");
    if (iVar1 == 0) {
      pcVar3 = Scl_LibertyReadString(p,pChild->Head);
      Vec_StrPutS_(vOut,pcVar3);
      for (pHead = (char *)Scl_LibertyItem(p,pChild->Child); pHead != (char *)0x0;
          pHead = (char *)Scl_LibertyItem(p,*(int *)(pHead + 0x20))) {
        iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pHead + 8),"capacitance");
        if (iVar1 == 0) {
          pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pHead + 0x10));
          dVar4 = atof(pcVar3);
          Vec_StrPutF_(vOut,(float)dVar4);
        }
      }
      for (pHead = (char *)Scl_LibertyItem(p,pChild->Child); pHead != (char *)0x0;
          pHead = (char *)Scl_LibertyItem(p,*(int *)(pHead + 0x20))) {
        iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pHead + 8),"slope");
        if (iVar1 == 0) {
          pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pHead + 0x10));
          dVar4 = atof(pcVar3);
          Vec_StrPutF_(vOut,(float)dVar4);
        }
      }
      Vec_StrPut_(vOut);
      iVar1 = Scl_LibertyItemNum(p,pChild,"fanout_length");
      Vec_StrPutI_(vOut,iVar1);
      Vec_StrPut_(vOut);
      for (pHead = (char *)Scl_LibertyItem(p,pChild->Child); pHead != (char *)0x0;
          pHead = (char *)Scl_LibertyItem(p,*(int *)(pHead + 0x20))) {
        iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pHead + 8),"fanout_length");
        if (iVar1 == 0) {
          pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pHead + 0x10));
          pcVar3 = strtok(pcVar3," ,");
          iVar1 = atoi(pcVar3);
          pcVar3 = strtok((char *)0x0," ");
          dVar4 = atof(pcVar3);
          Vec_StrPutI_(vOut,iVar1);
          Vec_StrPutF_(vOut,(float)dVar4);
          Vec_StrPut_(vOut);
        }
      }
      Vec_StrPut_(vOut);
    }
  }
  Vec_StrPut_(vOut);
  return;
}

Assistant:

void Scl_LibertyReadWireLoad( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Scl_ItemForEachChildName( p, pItem, pChild, "capacitance" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Scl_ItemForEachChildName( p, pItem, pChild, "slope" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "fanout_length") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "fanout_length" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            int    First  = atoi( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ") );
            Vec_StrPutI_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}